

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O3

bool IsChildWithParents(Package *package)

{
  element_type *peVar1;
  pointer pCVar2;
  ulong uVar3;
  const_iterator cVar4;
  pointer psVar5;
  __hashtable *__h;
  long lVar6;
  long lVar7;
  ulong uVar8;
  pointer psVar9;
  pointer pCVar10;
  pointer psVar11;
  long in_FS_OFFSET;
  bool bVar12;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  input_txids;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_a8;
  undefined1 *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar11 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)psVar11 - (long)psVar5;
  uVar8 = uVar3;
  if (0 < (long)uVar3 >> 6) {
    psVar9 = (pointer)((long)&(psVar5->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + (uVar3 & 0xffffffffffffffc0));
    lVar7 = ((long)uVar3 >> 6) + 1;
    psVar5 = psVar5 + 2;
    do {
      if (psVar5[-2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar5 = psVar5 + -2;
        goto LAB_0097c004;
      }
      if (psVar5[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar5 = psVar5 + -1;
        goto LAB_0097c004;
      }
      if ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) goto LAB_0097c004;
      if (psVar5[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar5 = psVar5 + 1;
        goto LAB_0097c004;
      }
      lVar7 = lVar7 + -1;
      psVar5 = psVar5 + 4;
    } while (1 < lVar7);
    psVar5 = psVar9;
    uVar8 = (long)psVar11 - (long)psVar9;
  }
  lVar7 = (long)uVar8 >> 4;
  if (lVar7 == 1) {
LAB_0097bfe7:
    if ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar5 = psVar11;
    }
LAB_0097c004:
    if (psVar5 != psVar11) {
      __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/packages.cpp"
                    ,0x79,"bool IsChildWithParents(const Package &)");
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0097bfdd:
      if ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar5 = psVar5 + 1;
        goto LAB_0097bfe7;
      }
      goto LAB_0097c004;
    }
    if (lVar7 == 3) {
      if ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar5 = psVar5 + 1;
        goto LAB_0097bfdd;
      }
      goto LAB_0097c004;
    }
  }
  if (uVar3 < 0x11) {
    bVar12 = false;
    goto LAB_0097c1c4;
  }
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&_Stack_a8);
  _Stack_a8._M_buckets = &_Stack_a8._M_single_bucket;
  _Stack_a8._M_bucket_count = 1;
  _Stack_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_a8._M_element_count = 0;
  _Stack_a8._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_a8._M_rehash_policy._M_next_resize = 0;
  _Stack_a8._M_single_bucket = (__node_base_ptr)0x0;
  peVar1 = psVar11[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar10 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar10 != pCVar2) {
    do {
      local_58 = *(undefined4 *)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data;
      uStack_54 = *(undefined4 *)
                   ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 4);
      uStack_50 = *(undefined4 *)
                   ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 8);
      uStack_4c = *(undefined4 *)
                   ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0xc);
      local_48 = *(undefined4 *)
                  ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x10);
      uStack_44 = *(undefined4 *)
                   ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x14);
      uStack_40 = *(undefined4 *)
                   ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x18);
      uStack_3c = *(undefined4 *)
                   ((long)&(pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x1c);
      local_60 = (undefined1 *)&_Stack_a8;
      std::
      _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&_Stack_a8,&local_58,&local_60);
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != pCVar2);
  }
  psVar5 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar11 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish + -1;
  lVar7 = (long)psVar11 - (long)psVar5;
  if (0 < lVar7 >> 6) {
    lVar6 = (lVar7 >> 6) + 1;
    psVar5 = psVar5 + 2;
    do {
      psVar9 = psVar5;
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &((psVar9[-2].
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0) {
        psVar9 = psVar9 + -2;
        goto LAB_0097c1b6;
      }
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &((psVar9[-1].
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0) {
        psVar9 = psVar9 + -1;
        goto LAB_0097c1b6;
      }
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &(((psVar9->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)->hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0)
      goto LAB_0097c1b6;
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &((psVar9[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0) {
        psVar9 = psVar9 + 1;
        goto LAB_0097c1b6;
      }
      lVar6 = lVar6 + -1;
      lVar7 = lVar7 + -0x40;
      psVar5 = psVar9 + 4;
    } while (1 < lVar6);
    psVar5 = psVar9 + 2;
  }
  lVar7 = lVar7 >> 4;
  if (lVar7 == 1) {
LAB_0097c18a:
    cVar4 = std::
            _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&_Stack_a8,
                   &(((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
    psVar9 = psVar5;
    if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
      psVar9 = psVar11;
    }
  }
  else if (lVar7 == 2) {
LAB_0097c171:
    cVar4 = std::
            _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&_Stack_a8,
                   &(((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
    psVar9 = psVar5;
    if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
      psVar5 = psVar5 + 1;
      goto LAB_0097c18a;
    }
  }
  else {
    psVar9 = psVar11;
    if ((lVar7 == 3) &&
       (cVar4 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,
                       &(((psVar5->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         )->hash).m_wrapped), psVar9 = psVar5,
       cVar4.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0)) {
      psVar5 = psVar5 + 1;
      goto LAB_0097c171;
    }
  }
LAB_0097c1b6:
  bVar12 = psVar9 == psVar11;
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&_Stack_a8);
LAB_0097c1c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool IsChildWithParents(const Package& package)
{
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));
    if (package.size() < 2) return false;

    // The package is expected to be sorted, so the last transaction is the child.
    const auto& child = package.back();
    std::unordered_set<uint256, SaltedTxidHasher> input_txids;
    std::transform(child->vin.cbegin(), child->vin.cend(),
                   std::inserter(input_txids, input_txids.end()),
                   [](const auto& input) { return input.prevout.hash; });

    // Every transaction must be a parent of the last transaction in the package.
    return std::all_of(package.cbegin(), package.cend() - 1,
                       [&input_txids](const auto& ptx) { return input_txids.count(ptx->GetHash()) > 0; });
}